

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

void __thiscall
soul::heart::StructElement::StructElement
          (StructElement *this,CodeLocation *l,Expression *v,string *member)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Structure *this_00;
  string_view memberName;
  CodeLocation local_38;
  
  local_38.sourceCode.object = (l->sourceCode).object;
  local_38.location.data = (l->location).data;
  (l->sourceCode).object = (SourceCodeText *)0x0;
  Expression::Expression(&this->super_Expression,&local_38);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_38.sourceCode);
  (this->super_Expression).super_Object._vptr_Object = (_func_int **)&PTR__StructElement_002fc3f8;
  (this->parent).object = v;
  std::__cxx11::string::string((string *)&this->memberName,(string *)member);
  iVar2 = (*(v->super_Object)._vptr_Object[2])(v);
  if (*(char *)CONCAT44(extraout_var,iVar2) == '\x06') {
    iVar2 = (*(v->super_Object)._vptr_Object[2])(v);
    this_00 = Type::getStructRef((Type *)CONCAT44(extraout_var_00,iVar2));
    memberName._M_str = (this->memberName)._M_dataplus._M_p;
    memberName._M_len = (this->memberName)._M_string_length;
    bVar1 = Structure::hasMemberWithName(this_00,memberName);
    if (bVar1) {
      return;
    }
  }
  throwInternalCompilerError
            ("v.getType().isStruct() && v.getType().getStructRef().hasMemberWithName (memberName)",
             "StructElement",0x283);
}

Assistant:

StructElement (CodeLocation l, Expression& v, std::string member)
           : Expression (std::move (l)), parent (v), memberName (std::move (member))
        {
            SOUL_ASSERT (v.getType().isStruct() && v.getType().getStructRef().hasMemberWithName (memberName));
        }